

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_fma::forward_inplace(GELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  undefined1 (*pauVar24) [32];
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 extraout_var [60];
  
  if ((this->super_GELU).fast_gelu != 0) {
    iVar25 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar29 = 0;
    uVar28 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar28 = uVar29;
    }
    for (; uVar29 != uVar28; uVar29 = uVar29 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar24 = (undefined1 (*) [32])(sVar4 * uVar29 * sVar3 + (long)pvVar2);
      lVar27 = 0;
      for (iVar26 = 0; iVar26 + 7 < iVar25; iVar26 = iVar26 + 8) {
        auVar1 = *pauVar24;
        fVar6 = auVar1._0_4_;
        fVar8 = auVar1._4_4_;
        fVar10 = auVar1._8_4_;
        fVar12 = auVar1._12_4_;
        fVar14 = auVar1._16_4_;
        fVar16 = auVar1._20_4_;
        fVar18 = auVar1._24_4_;
        auVar5._4_4_ = fVar8 * fVar8 * 0.044715;
        auVar5._0_4_ = fVar6 * fVar6 * 0.044715;
        auVar5._8_4_ = fVar10 * fVar10 * 0.044715;
        auVar5._12_4_ = fVar12 * fVar12 * 0.044715;
        auVar5._16_4_ = fVar14 * fVar14 * 0.044715;
        auVar5._20_4_ = fVar16 * fVar16 * 0.044715;
        auVar5._24_4_ = fVar18 * fVar18 * 0.044715;
        auVar5._28_4_ = in_ZMM1._28_4_;
        auVar35 = vfmadd213ps_fma(auVar5,auVar1,auVar1);
        auVar38._8_4_ = 0xc1100000;
        auVar38._0_8_ = 0xc1100000c1100000;
        auVar38._12_4_ = 0xc1100000;
        auVar38._16_4_ = 0xc1100000;
        auVar38._20_4_ = 0xc1100000;
        auVar38._24_4_ = 0xc1100000;
        auVar38._28_4_ = 0xc1100000;
        auVar5 = vmaxps_avx(auVar38,ZEXT1632(CONCAT412(auVar35._12_4_ * 0.7978845,
                                                       CONCAT48(auVar35._8_4_ * 0.7978845,
                                                                CONCAT44(auVar35._4_4_ * 0.7978845,
                                                                         auVar35._0_4_ * 0.7978845))
                                                      )));
        auVar39._8_4_ = 0x41100000;
        auVar39._0_8_ = 0x4110000041100000;
        auVar39._12_4_ = 0x41100000;
        auVar39._16_4_ = 0x41100000;
        auVar39._20_4_ = 0x41100000;
        auVar39._24_4_ = 0x41100000;
        auVar39._28_4_ = 0x41100000;
        auVar5 = vminps_avx(auVar39,auVar5);
        fVar7 = auVar5._0_4_;
        fVar9 = auVar5._4_4_;
        auVar20._4_4_ = fVar9 * fVar9;
        auVar20._0_4_ = fVar7 * fVar7;
        fVar11 = auVar5._8_4_;
        auVar20._8_4_ = fVar11 * fVar11;
        fVar13 = auVar5._12_4_;
        auVar20._12_4_ = fVar13 * fVar13;
        fVar15 = auVar5._16_4_;
        auVar20._16_4_ = fVar15 * fVar15;
        fVar17 = auVar5._20_4_;
        auVar20._20_4_ = fVar17 * fVar17;
        fVar19 = auVar5._24_4_;
        auVar20._24_4_ = fVar19 * fVar19;
        auVar20._28_4_ = 0x41100000;
        auVar42._8_4_ = 0xa59f25c0;
        auVar42._0_8_ = 0xa59f25c0a59f25c0;
        auVar42._12_4_ = 0xa59f25c0;
        auVar42._16_4_ = 0xa59f25c0;
        auVar42._20_4_ = 0xa59f25c0;
        auVar42._24_4_ = 0xa59f25c0;
        auVar42._28_4_ = 0xa59f25c0;
        auVar50._8_4_ = 0x2a61337e;
        auVar50._0_8_ = 0x2a61337e2a61337e;
        auVar50._12_4_ = 0x2a61337e;
        auVar50._16_4_ = 0x2a61337e;
        auVar50._20_4_ = 0x2a61337e;
        auVar50._24_4_ = 0x2a61337e;
        auVar50._28_4_ = 0x2a61337e;
        auVar35 = vfmadd213ps_fma(auVar42,auVar20,auVar50);
        auVar51._8_4_ = 0xaebd37ff;
        auVar51._0_8_ = 0xaebd37ffaebd37ff;
        auVar51._12_4_ = 0xaebd37ff;
        auVar51._16_4_ = 0xaebd37ff;
        auVar51._20_4_ = 0xaebd37ff;
        auVar51._24_4_ = 0xaebd37ff;
        auVar51._28_4_ = 0xaebd37ff;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar51);
        auVar52._8_4_ = 0x335c0041;
        auVar52._0_8_ = 0x335c0041335c0041;
        auVar52._12_4_ = 0x335c0041;
        auVar52._16_4_ = 0x335c0041;
        auVar52._20_4_ = 0x335c0041;
        auVar52._24_4_ = 0x335c0041;
        auVar52._28_4_ = 0x335c0041;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar52);
        auVar53._8_4_ = 0x3779434a;
        auVar53._0_8_ = 0x3779434a3779434a;
        auVar53._12_4_ = 0x3779434a;
        auVar53._16_4_ = 0x3779434a;
        auVar53._20_4_ = 0x3779434a;
        auVar53._24_4_ = 0x3779434a;
        auVar53._28_4_ = 0x3779434a;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar53);
        auVar54._8_4_ = 0x3a270ded;
        auVar54._0_8_ = 0x3a270ded3a270ded;
        auVar54._12_4_ = 0x3a270ded;
        auVar54._16_4_ = 0x3a270ded;
        auVar54._20_4_ = 0x3a270ded;
        auVar54._24_4_ = 0x3a270ded;
        auVar54._28_4_ = 0x3a270ded;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar54);
        auVar55._8_4_ = 0x3ba059dc;
        auVar55._0_8_ = 0x3ba059dc3ba059dc;
        auVar55._12_4_ = 0x3ba059dc;
        auVar55._16_4_ = 0x3ba059dc;
        auVar55._20_4_ = 0x3ba059dc;
        auVar55._24_4_ = 0x3ba059dc;
        auVar55._28_4_ = 0x3ba059dc;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar55);
        auVar21._4_4_ = auVar35._4_4_ * fVar9;
        auVar21._0_4_ = auVar35._0_4_ * fVar7;
        auVar21._8_4_ = auVar35._8_4_ * fVar11;
        auVar21._12_4_ = auVar35._12_4_ * fVar13;
        auVar21._16_4_ = fVar15 * 0.0;
        auVar21._20_4_ = fVar17 * 0.0;
        auVar21._24_4_ = fVar19 * 0.0;
        auVar21._28_4_ = auVar5._28_4_;
        auVar43._8_4_ = 0x35a0d3d8;
        auVar43._0_8_ = 0x35a0d3d835a0d3d8;
        auVar43._12_4_ = 0x35a0d3d8;
        auVar43._16_4_ = 0x35a0d3d8;
        auVar43._20_4_ = 0x35a0d3d8;
        auVar43._24_4_ = 0x35a0d3d8;
        auVar43._28_4_ = 0x35a0d3d8;
        auVar58._8_4_ = 0x38f895d6;
        auVar58._0_8_ = 0x38f895d638f895d6;
        auVar58._12_4_ = 0x38f895d6;
        auVar58._16_4_ = 0x38f895d6;
        auVar58._20_4_ = 0x38f895d6;
        auVar58._24_4_ = 0x38f895d6;
        auVar58._28_4_ = 0x38f895d6;
        auVar35 = vfmadd213ps_fma(auVar43,auVar20,auVar58);
        auVar59._8_4_ = 0x3b14aa05;
        auVar59._0_8_ = 0x3b14aa053b14aa05;
        auVar59._12_4_ = 0x3b14aa05;
        auVar59._16_4_ = 0x3b14aa05;
        auVar59._20_4_ = 0x3b14aa05;
        auVar59._24_4_ = 0x3b14aa05;
        auVar59._28_4_ = 0x3b14aa05;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar59);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar20,auVar55);
        auVar5 = vdivps_avx(auVar21,ZEXT1632(auVar35));
        in_ZMM1 = ZEXT3264(auVar5);
        auVar22._4_4_ = fVar8 * 0.5;
        auVar22._0_4_ = fVar6 * 0.5;
        auVar22._8_4_ = fVar10 * 0.5;
        auVar22._12_4_ = fVar12 * 0.5;
        auVar22._16_4_ = fVar14 * 0.5;
        auVar22._20_4_ = fVar16 * 0.5;
        auVar22._24_4_ = fVar18 * 0.5;
        auVar22._28_4_ = auVar1._28_4_;
        auVar35 = vfmadd213ps_fma(auVar22,auVar5,auVar22);
        *pauVar24 = ZEXT1632(auVar35);
        pauVar24 = pauVar24 + 1;
        lVar27 = lVar27 + 8;
      }
      for (; iVar26 + 3 < iVar25; iVar26 = iVar26 + 4) {
        auVar35 = *(undefined1 (*) [16])*pauVar24;
        fVar6 = auVar35._0_4_;
        fVar8 = auVar35._4_4_;
        fVar10 = auVar35._8_4_;
        fVar12 = auVar35._12_4_;
        auVar32._0_4_ = fVar6 * fVar6 * 0.044715;
        auVar32._4_4_ = fVar8 * fVar8 * 0.044715;
        auVar32._8_4_ = fVar10 * fVar10 * 0.044715;
        auVar32._12_4_ = fVar12 * fVar12 * 0.044715;
        auVar35 = vfmadd213ps_fma(auVar32,auVar35,auVar35);
        auVar33._0_4_ = auVar35._0_4_ * 0.7978845;
        auVar33._4_4_ = auVar35._4_4_ * 0.7978845;
        auVar33._8_4_ = auVar35._8_4_ * 0.7978845;
        auVar33._12_4_ = auVar35._12_4_ * 0.7978845;
        auVar35._8_4_ = 0xc1100000;
        auVar35._0_8_ = 0xc1100000c1100000;
        auVar35._12_4_ = 0xc1100000;
        auVar35 = vmaxps_avx(auVar35,auVar33);
        auVar36._8_4_ = 0x41100000;
        auVar36._0_8_ = 0x4110000041100000;
        auVar36._12_4_ = 0x41100000;
        auVar35 = vminps_avx(auVar36,auVar35);
        fVar7 = auVar35._0_4_;
        auVar37._0_4_ = fVar7 * fVar7;
        fVar9 = auVar35._4_4_;
        auVar37._4_4_ = fVar9 * fVar9;
        fVar11 = auVar35._8_4_;
        auVar37._8_4_ = fVar11 * fVar11;
        fVar13 = auVar35._12_4_;
        auVar37._12_4_ = fVar13 * fVar13;
        auVar40._8_4_ = 0xa59f25c0;
        auVar40._0_8_ = 0xa59f25c0a59f25c0;
        auVar40._12_4_ = 0xa59f25c0;
        auVar44._8_4_ = 0x2a61337e;
        auVar44._0_8_ = 0x2a61337e2a61337e;
        auVar44._12_4_ = 0x2a61337e;
        auVar35 = vfmadd213ps_fma(auVar40,auVar37,auVar44);
        auVar45._8_4_ = 0xaebd37ff;
        auVar45._0_8_ = 0xaebd37ffaebd37ff;
        auVar45._12_4_ = 0xaebd37ff;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar45);
        auVar46._8_4_ = 0x335c0041;
        auVar46._0_8_ = 0x335c0041335c0041;
        auVar46._12_4_ = 0x335c0041;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar46);
        auVar47._8_4_ = 0x3779434a;
        auVar47._0_8_ = 0x3779434a3779434a;
        auVar47._12_4_ = 0x3779434a;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar47);
        auVar48._8_4_ = 0x3a270ded;
        auVar48._0_8_ = 0x3a270ded3a270ded;
        auVar48._12_4_ = 0x3a270ded;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar48);
        auVar49._8_4_ = 0x3ba059dc;
        auVar49._0_8_ = 0x3ba059dc3ba059dc;
        auVar49._12_4_ = 0x3ba059dc;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar49);
        auVar34._0_4_ = auVar35._0_4_ * fVar7;
        auVar34._4_4_ = auVar35._4_4_ * fVar9;
        auVar34._8_4_ = auVar35._8_4_ * fVar11;
        auVar34._12_4_ = auVar35._12_4_ * fVar13;
        auVar41._8_4_ = 0x35a0d3d8;
        auVar41._0_8_ = 0x35a0d3d835a0d3d8;
        auVar41._12_4_ = 0x35a0d3d8;
        auVar56._8_4_ = 0x38f895d6;
        auVar56._0_8_ = 0x38f895d638f895d6;
        auVar56._12_4_ = 0x38f895d6;
        auVar35 = vfmadd213ps_fma(auVar41,auVar37,auVar56);
        auVar57._8_4_ = 0x3b14aa05;
        auVar57._0_8_ = 0x3b14aa053b14aa05;
        auVar57._12_4_ = 0x3b14aa05;
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar57);
        auVar35 = vfmadd213ps_fma(auVar35,auVar37,auVar49);
        auVar35 = vdivps_avx(auVar34,auVar35);
        in_ZMM1 = ZEXT1664(auVar35);
        auVar30._0_4_ = fVar6 * 0.5;
        auVar30._4_4_ = fVar8 * 0.5;
        auVar30._8_4_ = fVar10 * 0.5;
        auVar30._12_4_ = fVar12 * 0.5;
        auVar35 = vfmadd213ps_fma(auVar30,auVar35,auVar30);
        *(undefined1 (*) [16])*pauVar24 = auVar35;
        pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
        lVar27 = lVar27 + 4;
      }
      lVar23 = sVar4 * sVar3 * uVar29;
      for (; (int)lVar27 < iVar25; lVar27 = lVar27 + 1) {
        fVar6 = *(float *)((long)pvVar2 + lVar27 * 4 + lVar23);
        fVar7 = fVar6 * 0.5;
        auVar35 = vfmadd213ss_fma(ZEXT416((uint)(fVar6 * fVar6 * 0.044715)),ZEXT416((uint)fVar6),
                                  ZEXT416((uint)fVar6));
        auVar31._0_4_ = tanhf(auVar35._0_4_ * 0.7978845);
        auVar31._4_60_ = extraout_var;
        in_ZMM1 = ZEXT464((uint)fVar7);
        auVar35 = vfmadd213ss_fma(auVar31._0_16_,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
        *(int *)((long)pvVar2 + lVar27 * 4 + lVar23) = auVar35._0_4_;
      }
    }
    return 0;
  }
  iVar25 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
  return iVar25;
}

Assistant:

int GELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}